

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeR.cpp
# Opt level: O3

void __thiscall OpenMD::ChargeR::writeChargeR(ChargeR *this)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"ChargeR: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#ChargeR ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection: (",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# r ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\tcharge\n",8);
    if ((this->chargeR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->chargeR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar4 = 0;
      do {
        dVar7 = this->deltaR_ * (double)uVar4;
        dVar5 = pow(this->deltaR_ + dVar7,3.0);
        dVar6 = pow(dVar7,3.0);
        dVar7 = (this->chargeR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        iVar1 = this->nProcessed_;
        poVar3 = std::ostream::_M_insert<double>(((double)uVar4 + 0.5) * this->deltaR_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
        poVar3 = std::ostream::_M_insert<double>
                           (dVar7 / ((((dVar5 - dVar6) * 12.566370614359172) / 3.0) * (double)iVar1)
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (uVar4 < (ulong)((long)(this->chargeR_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->chargeR_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ChargeR::writeChargeR() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#ChargeR "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "# r "
                << "\tcharge\n";
      RealType binCharge;
      for (unsigned int i = 0; i < chargeR_.size(); ++i) {
        RealType rLower = i * deltaR_;
        RealType rUpper = rLower + deltaR_;
        RealType volShell =
            (4.0 * Constants::PI) * (pow(rUpper, 3) - pow(rLower, 3)) / 3.0;

        RealType r = deltaR_ * (i + 0.5);

        binCharge = chargeR_[i] / (volShell * nProcessed_);

        rdfStream << r << "\t" << binCharge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }